

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<unsigned_short,_double>::Run
          (DataTransform<unsigned_short,_double> *this,istream *input_stream)

{
  double dVar1;
  NumericType NVar2;
  WarningType WVar3;
  bool bVar4;
  char *__nptr;
  bool bVar5;
  uint uVar6;
  int *piVar7;
  undefined8 uVar8;
  ulong uVar9;
  ostream *poVar10;
  size_t sVar11;
  int iVar12;
  double dVar13;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  unsigned_short input_data;
  string word;
  char buffer [128];
  ushort local_288;
  ushort local_286;
  int local_284;
  uint local_280;
  int local_27c;
  double local_278;
  undefined8 uStack_270;
  string *local_268;
  double local_260;
  double local_258;
  string local_250;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_268 = &this->print_format_;
  dVar13 = 0.0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      local_278 = dVar13;
      if (local_228 == 0) {
        bVar4 = true;
        bVar5 = false;
      }
      else {
        piVar7 = __errno_location();
        local_284 = *piVar7;
        *piVar7 = 0;
        strtold(__nptr,(char **)&local_250);
        if (local_250._M_dataplus._M_p == __nptr) {
          uVar8 = std::__throw_invalid_argument("stold");
LAB_0012fadb:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar8);
        }
        if (*piVar7 == 0) {
          *piVar7 = local_284;
        }
        else if (*piVar7 == 0x22) {
          uVar8 = std::__throw_out_of_range("stold");
          goto LAB_0012fadb;
        }
        local_286 = in_FPUControlWord | 0xc00;
        local_27c = (int)ROUND(in_ST0);
        local_288 = (ushort)local_27c;
        bVar4 = false;
        bVar5 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      iVar12 = SUB84(local_278,0);
      dVar13 = local_278;
      if (bVar5) goto LAB_0012f7b9;
      if (bVar4) {
        if (!bVar4) {
          return false;
        }
        goto LAB_0012fa87;
      }
    }
    else {
      bVar5 = sptk::ReadStream<unsigned_short>(&local_288,input_stream);
      if (!bVar5) {
LAB_0012fa87:
        if (this->is_ascii_output_ != true) {
          return true;
        }
        if ((int)((long)((ulong)(uint)(SUB84(dVar13,0) >> 0x1f) << 0x20 | (ulong)dVar13 & 0xffffffff
                        ) % (long)this->num_column_) != 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
          return true;
        }
        return true;
      }
LAB_0012f7b9:
      iVar12 = SUB84(dVar13,0);
      uVar9 = (ulong)local_288;
      dVar13 = this->minimum_value_;
      uVar14 = SUB84(dVar13,0);
      uVar16 = (undefined4)((ulong)dVar13 >> 0x20);
      dVar1 = this->maximum_value_;
      uVar6 = (uint)local_288;
      if (dVar1 <= dVar13) {
LAB_0012f972:
        dVar13 = (double)uVar6;
        in_ST7 = in_ST6;
        if (this->rounding_ == true) {
          if (uVar9 == 0) {
            dVar13 = dVar13 + -0.5;
          }
          else {
            dVar13 = dVar13 + 0.5;
          }
        }
      }
      else {
        NVar2 = this->input_numeric_type_;
        uVar15 = SUB84(dVar1,0);
        uVar17 = (undefined4)((ulong)dVar1 >> 0x20);
        if (NVar2 == kFloatingPoint) {
          in_ST6 = in_ST5;
          local_280 = uVar6;
          local_258 = dVar13;
          if (((double)uVar6 < dVar13) ||
             (uVar14 = uVar15, uVar16 = uVar17, local_260 = dVar1, dVar1 < (double)uVar6))
          goto LAB_0012f8c0;
          goto LAB_0012f972;
        }
        if (NVar2 == kUnsignedInteger) {
          if (((ulong)((long)(dVar13 - 9.223372036854776e+18) & (long)dVar13 >> 0x3f | (long)dVar13)
               <= uVar9) &&
             (uVar14 = uVar15, uVar16 = uVar17,
             uVar9 <= (ulong)((long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f |
                             (long)dVar1))) goto LAB_0012f972;
        }
        else if ((NVar2 != kSignedInteger) ||
                (((long)dVar13 <= (long)uVar9 &&
                 (uVar14 = uVar15, uVar16 = uVar17, (long)uVar9 <= (long)dVar1))))
        goto LAB_0012f972;
LAB_0012f8c0:
        in_ST7 = in_ST6;
        dVar13 = (double)CONCAT44(uVar16,uVar14);
        if (this->warning_type_ != kIgnore) {
          local_278 = (double)CONCAT44(uVar16,uVar14);
          uStack_270 = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar12);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"th data is over the range of output type",0x28);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"x2x","");
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p);
          }
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          dVar13 = local_278;
          if (WVar3 == kExit) {
            return false;
          }
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar5 = sptk::SnPrintf<double>(dVar13,local_268,0x80,local_b8);
        if (!bVar5) {
          return false;
        }
        sVar11 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar11);
        if ((iVar12 + 1) % this->num_column_ == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        }
      }
      else {
        bVar5 = sptk::WriteStream<double>(dVar13,(ostream *)&std::cout);
        if (!bVar5) {
          return false;
        }
      }
    }
    dVar13 = (double)(ulong)(iVar12 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }